

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O3

void lowbd_fwd_txfm2d_64x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long lVar1;
  undefined4 *puVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  int8_t *piVar12;
  int iVar13;
  int16_t *piVar14;
  uint uVar15;
  long lVar16;
  int32_t *piVar17;
  long lVar18;
  int iVar19;
  undefined1 *puVar20;
  undefined4 uVar21;
  __m128i round_1;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  __m128i round;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined4 uVar39;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [16];
  undefined4 uVar48;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i buf0 [64];
  __m128i bufB [64];
  __m128i bufA [64];
  __m128i buf1 [512];
  longlong local_2c38 [2];
  undefined2 auStack_2c28 [8];
  undefined1 auStack_2c18 [16];
  undefined2 auStack_2c08 [8];
  undefined1 auStack_2bf8 [16];
  undefined2 auStack_2be8 [8];
  undefined1 auStack_2bd8 [16];
  undefined2 auStack_2bc8 [456];
  undefined8 local_2838;
  int aiStack_2830 [254];
  undefined8 local_2438;
  int aiStack_2430 [254];
  undefined1 local_2038 [112];
  undefined1 local_1fc8 [8088];
  undefined1 auVar22 [12];
  undefined1 auVar24 [16];
  undefined1 auVar27 [12];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  piVar12 = av1_fwd_txfm_shift_ls[4];
  puVar20 = local_1fc8;
  lVar18 = 0;
  do {
    lVar16 = 0;
    piVar14 = input;
    do {
      uVar7 = *(undefined8 *)(piVar14 + 4);
      *(undefined8 *)((long)local_2c38 + lVar16) = *(undefined8 *)piVar14;
      *(undefined8 *)((long)auStack_2c28 + lVar16 + -8) = uVar7;
      lVar16 = lVar16 + 0x10;
      piVar14 = piVar14 + stride;
    } while (lVar16 != 0x400);
    bVar3 = *piVar12;
    if ((char)bVar3 < '\0') {
      auVar23 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar23 = pshuflw(auVar23,auVar23,0);
      auVar23._4_4_ = auVar23._0_4_;
      auVar23._8_4_ = auVar23._0_4_;
      auVar23._12_4_ = auVar23._0_4_;
      lVar16 = 0;
      do {
        auVar30 = paddsw(*(undefined1 (*) [16])((long)local_2c38 + lVar16),auVar23);
        auVar30 = psraw(auVar30,ZEXT416((uint)-(int)(char)bVar3));
        *(undefined1 (*) [16])((long)local_2c38 + lVar16) = auVar30;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x400);
    }
    else if (bVar3 != 0) {
      lVar16 = 0;
      do {
        auVar23 = psllw(*(undefined1 (*) [16])((long)local_2c38 + lVar16),
                        ZEXT416((uint)(int)(char)bVar3));
        *(undefined1 (*) [16])((long)local_2c38 + lVar16) = auVar23;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x400);
    }
    av1_fdct8x64_new_sse2(&local_2c38,&local_2c38,'\r');
    bVar3 = piVar12[1];
    uVar15 = (uint)(char)bVar3;
    if ((int)uVar15 < 0) {
      auVar23 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar23 = pshuflw(auVar23,auVar23,0);
      auVar30._0_4_ = auVar23._0_4_;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      lVar16 = 0;
      do {
        auVar23 = paddsw(*(undefined1 (*) [16])((long)local_2c38 + lVar16),auVar30);
        auVar23 = psraw(auVar23,ZEXT416(-uVar15));
        *(undefined1 (*) [16])((long)local_2c38 + lVar16) = auVar23;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x400);
    }
    else if (bVar3 != 0) {
      lVar16 = 0;
      do {
        auVar23 = psllw(*(undefined1 (*) [16])((long)local_2c38 + lVar16),ZEXT416(uVar15));
        *(undefined1 (*) [16])((long)local_2c38 + lVar16) = auVar23;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x400);
    }
    lVar16 = 0;
    do {
      auVar23 = *(undefined1 (*) [16])((long)local_2c38 + lVar16);
      auVar30 = *(undefined1 (*) [16])((long)auStack_2c28 + lVar16 + 0x10);
      auVar34._0_12_ = auVar23._0_12_;
      auVar34._12_2_ = auVar23._6_2_;
      auVar34._14_2_ = *(undefined2 *)((long)auStack_2c28 + lVar16 + 6);
      auVar33._12_4_ = auVar34._12_4_;
      auVar33._0_10_ = auVar23._0_10_;
      auVar33._10_2_ = *(undefined2 *)((long)auStack_2c28 + lVar16 + 4);
      auVar32._10_6_ = auVar33._10_6_;
      auVar32._0_8_ = auVar23._0_8_;
      auVar32._8_2_ = auVar23._4_2_;
      auVar8._4_8_ = auVar32._8_8_;
      auVar8._2_2_ = *(undefined2 *)((long)auStack_2c28 + lVar16 + 2);
      auVar8._0_2_ = auVar23._2_2_;
      auVar31._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_2c28 + lVar16),auVar23._0_2_);
      auVar31._4_12_ = auVar8;
      auVar46._0_12_ = auVar30._0_12_;
      auVar46._12_2_ = auVar30._6_2_;
      auVar46._14_2_ = *(undefined2 *)((long)auStack_2c08 + lVar16 + 6);
      auVar45._12_4_ = auVar46._12_4_;
      auVar45._0_10_ = auVar30._0_10_;
      auVar45._10_2_ = *(undefined2 *)((long)auStack_2c08 + lVar16 + 4);
      auVar44._10_6_ = auVar45._10_6_;
      auVar44._0_8_ = auVar30._0_8_;
      auVar44._8_2_ = auVar30._4_2_;
      auVar9._4_8_ = auVar44._8_8_;
      auVar9._2_2_ = *(undefined2 *)((long)auStack_2c08 + lVar16 + 2);
      auVar9._0_2_ = auVar30._2_2_;
      auVar28 = *(undefined1 (*) [16])((long)auStack_2c08 + lVar16 + 0x10);
      auVar38._0_12_ = auVar28._0_12_;
      auVar38._12_2_ = auVar28._6_2_;
      auVar38._14_2_ = *(undefined2 *)((long)auStack_2be8 + lVar16 + 6);
      auVar37._12_4_ = auVar38._12_4_;
      auVar37._0_10_ = auVar28._0_10_;
      auVar37._10_2_ = *(undefined2 *)((long)auStack_2be8 + lVar16 + 4);
      auVar36._10_6_ = auVar37._10_6_;
      auVar36._0_8_ = auVar28._0_8_;
      auVar36._8_2_ = auVar28._4_2_;
      auVar10._4_8_ = auVar36._8_8_;
      auVar10._2_2_ = *(undefined2 *)((long)auStack_2be8 + lVar16 + 2);
      auVar10._0_2_ = auVar28._2_2_;
      auVar35._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_2be8 + lVar16),auVar28._0_2_);
      auVar35._4_12_ = auVar10;
      auVar34 = *(undefined1 (*) [16])((long)auStack_2be8 + lVar16 + 0x10);
      uVar4 = *(undefined2 *)((long)auStack_2bc8 + lVar16);
      auVar54._0_12_ = auVar34._0_12_;
      auVar54._12_2_ = auVar34._6_2_;
      auVar54._14_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar16 + 6);
      auVar53._12_4_ = auVar54._12_4_;
      auVar53._0_10_ = auVar34._0_10_;
      auVar53._10_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar16 + 4);
      auVar52._10_6_ = auVar53._10_6_;
      auVar52._0_8_ = auVar34._0_8_;
      auVar52._8_2_ = auVar34._4_2_;
      auVar11._4_8_ = auVar52._8_8_;
      auVar11._2_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar16 + 2);
      auVar11._0_2_ = auVar34._2_2_;
      uVar21 = CONCAT22(*(undefined2 *)((long)auStack_2c28 + lVar16 + 8),auVar23._8_2_);
      auVar22._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2c28 + lVar16 + 10),
                    CONCAT24(auVar23._10_2_,uVar21));
      auVar22._8_2_ = auVar23._12_2_;
      auVar22._10_2_ = *(undefined2 *)((long)auStack_2c28 + lVar16 + 0xc);
      auVar24._12_2_ = auVar23._14_2_;
      auVar24._0_12_ = auVar22;
      auVar24._14_2_ = *(undefined2 *)((long)auStack_2c28 + lVar16 + 0xe);
      uVar39 = CONCAT22(*(undefined2 *)((long)auStack_2c08 + lVar16 + 8),auVar30._8_2_);
      auVar40._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2c08 + lVar16 + 10),
                    CONCAT24(auVar30._10_2_,uVar39));
      auVar40._8_2_ = auVar30._12_2_;
      auVar40._10_2_ = *(undefined2 *)((long)auStack_2c08 + lVar16 + 0xc);
      auVar41._12_2_ = auVar30._14_2_;
      auVar41._0_12_ = auVar40;
      auVar41._14_2_ = *(undefined2 *)((long)auStack_2c08 + lVar16 + 0xe);
      uVar26 = CONCAT22(*(undefined2 *)((long)auStack_2be8 + lVar16 + 8),auVar28._8_2_);
      auVar27._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2be8 + lVar16 + 10),
                    CONCAT24(auVar28._10_2_,uVar26));
      auVar27._8_2_ = auVar28._12_2_;
      auVar27._10_2_ = *(undefined2 *)((long)auStack_2be8 + lVar16 + 0xc);
      auVar28._12_2_ = auVar28._14_2_;
      auVar28._0_12_ = auVar27;
      auVar28._14_2_ = *(undefined2 *)((long)auStack_2be8 + lVar16 + 0xe);
      uVar48 = CONCAT22(*(undefined2 *)((long)auStack_2bc8 + lVar16 + 8),auVar34._8_2_);
      auVar49._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_2bc8 + lVar16 + 10),
                    CONCAT24(auVar34._10_2_,uVar48));
      auVar49._8_2_ = auVar34._12_2_;
      auVar49._10_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar16 + 0xc);
      auVar50._12_2_ = auVar34._14_2_;
      auVar50._0_12_ = auVar49;
      auVar50._14_2_ = *(undefined2 *)((long)auStack_2bc8 + lVar16 + 0xe);
      auVar42._0_8_ = auVar31._0_8_;
      auVar42._8_4_ = auVar8._0_4_;
      auVar42._12_4_ = auVar9._0_4_;
      auVar43._0_8_ = auVar35._0_8_;
      auVar43._8_4_ = auVar10._0_4_;
      auVar43._12_4_ = auVar11._0_4_;
      auVar47._8_4_ = (int)((ulong)auVar22._0_8_ >> 0x20);
      auVar47._0_8_ = auVar22._0_8_;
      auVar47._12_4_ = (int)((ulong)auVar40._0_8_ >> 0x20);
      auVar51._8_4_ = (int)((ulong)auVar27._0_8_ >> 0x20);
      auVar51._0_8_ = auVar27._0_8_;
      auVar51._12_4_ = (int)((ulong)auVar49._0_8_ >> 0x20);
      auVar29._0_8_ = CONCAT44(auVar49._8_4_,auVar27._8_4_);
      auVar29._8_4_ = auVar28._12_4_;
      auVar29._12_4_ = auVar50._12_4_;
      *(ulong *)(puVar20 + lVar16 * 8 + -0x70) =
           CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_2c08 + lVar16),auVar30._0_2_),
                    auVar31._0_4_);
      *(ulong *)((long)(puVar20 + lVar16 * 8 + -0x70) + 8) =
           CONCAT44(CONCAT22(uVar4,auVar34._0_2_),auVar35._0_4_);
      *(long *)(puVar20 + lVar16 * 8 + -0x60) = auVar42._8_8_;
      *(long *)((long)(puVar20 + lVar16 * 8 + -0x60) + 8) = auVar43._8_8_;
      puVar2 = (undefined4 *)(puVar20 + lVar16 * 8 + -0x50);
      *puVar2 = auVar32._8_4_;
      puVar2[1] = auVar44._8_4_;
      puVar2[2] = auVar36._8_4_;
      puVar2[3] = auVar52._8_4_;
      lVar1 = lVar16 * 8;
      *(undefined4 *)(puVar20 + lVar1 + -0x38) = auVar33._12_4_;
      *(undefined4 *)(puVar20 + lVar1 + -0x34) = auVar45._12_4_;
      *(undefined4 *)(puVar20 + lVar1 + -0x30) = auVar37._12_4_;
      *(undefined4 *)(puVar20 + lVar1 + -0x2c) = auVar53._12_4_;
      *(ulong *)(puVar20 + lVar16 * 8 + -0x30) = CONCAT44(uVar39,uVar21);
      *(ulong *)((long)(puVar20 + lVar16 * 8 + -0x30) + 8) = CONCAT44(uVar48,uVar26);
      *(long *)(puVar20 + lVar16 * 8 + -0x20) = auVar47._8_8_;
      *(long *)((long)(puVar20 + lVar16 * 8 + -0x20) + 8) = auVar51._8_8_;
      puVar2 = (undefined4 *)(puVar20 + lVar16 * 8 + -0x10);
      *puVar2 = auVar22._8_4_;
      puVar2[1] = auVar40._8_4_;
      *(undefined8 *)(puVar2 + 2) = auVar29._0_8_;
      *(int *)(puVar20 + lVar16 * 8 + 8) = auVar24._12_4_;
      *(int *)(puVar20 + lVar16 * 8 + 0xc) = auVar41._12_4_;
      *(long *)(puVar20 + lVar16 * 8 + 8) = auVar29._8_8_;
      lVar16 = lVar16 + 0x80;
    } while (lVar16 != 0x200);
    lVar18 = lVar18 + 1;
    input = input + 8;
    puVar20 = puVar20 + 0x80;
  } while (lVar18 != 8);
  piVar17 = output + 4;
  puVar20 = local_2038;
  lVar18 = 0;
  do {
    lVar16 = 0;
    do {
      auVar23 = *(undefined1 (*) [16])(puVar20 + lVar16);
      auVar29 = pmovsxwd(auVar29,auVar23);
      *(undefined1 (*) [16])((long)&local_2438 + lVar16) = auVar29;
      auVar25._8_4_ = auVar23._8_4_;
      auVar25._12_4_ = auVar23._12_4_;
      auVar25._0_8_ = auVar23._8_8_;
      auVar23 = pmovsxwd(auVar25,auVar25);
      *(undefined1 (*) [16])((long)&local_2838 + lVar16) = auVar23;
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x400);
    av1_fdct64_sse4_1((__m128i *)&local_2438,(__m128i *)&local_2438,'\n',1,1);
    av1_fdct64_sse4_1((__m128i *)&local_2838,(__m128i *)&local_2838,'\n',1,1);
    bVar3 = piVar12[2];
    iVar13 = (int)(char)bVar3;
    if (iVar13 < 0) {
      iVar19 = 1 << (~bVar3 & 0x1f);
      auVar23 = ZEXT416((uint)-iVar13);
      lVar16 = 0;
      do {
        iVar5 = *(int *)((long)aiStack_2430 + lVar16);
        iVar6 = *(int *)((long)aiStack_2430 + lVar16 + 4);
        *(int *)((long)&local_2438 + lVar16) =
             *(int *)((long)&local_2438 + lVar16) + iVar19 >> auVar23;
        *(int *)((long)&local_2438 + lVar16 + 4) =
             *(int *)((long)&local_2438 + lVar16 + 4) + iVar19 >> auVar23;
        *(int *)((long)aiStack_2430 + lVar16) = iVar5 + iVar19 >> auVar23;
        *(int *)((long)aiStack_2430 + lVar16 + 4) = iVar6 + iVar19 >> auVar23;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x200);
    }
    else {
      lVar16 = 0;
      do {
        uVar21 = *(undefined4 *)((long)aiStack_2430 + lVar16);
        uVar26 = *(undefined4 *)((long)aiStack_2430 + lVar16 + 4);
        *(int *)((long)&local_2438 + lVar16) = *(int *)((long)&local_2438 + lVar16) << iVar13;
        *(undefined4 *)((long)&local_2438 + lVar16 + 4) =
             *(undefined4 *)((long)&local_2438 + lVar16 + 4);
        *(undefined4 *)((long)aiStack_2430 + lVar16) = uVar21;
        *(undefined4 *)((long)aiStack_2430 + lVar16 + 4) = uVar26;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x200);
    }
    if ((char)bVar3 < '\0') {
      iVar19 = 1 << (~bVar3 & 0x1f);
      auVar29 = ZEXT416((uint)-iVar13);
      lVar16 = 0;
      do {
        iVar13 = *(int *)((long)aiStack_2830 + lVar16);
        iVar5 = *(int *)((long)aiStack_2830 + lVar16 + 4);
        *(int *)((long)&local_2838 + lVar16) =
             *(int *)((long)&local_2838 + lVar16) + iVar19 >> auVar29;
        *(int *)((long)&local_2838 + lVar16 + 4) =
             *(int *)((long)&local_2838 + lVar16 + 4) + iVar19 >> auVar29;
        *(int *)((long)aiStack_2830 + lVar16) = iVar13 + iVar19 >> auVar29;
        *(int *)((long)aiStack_2830 + lVar16 + 4) = iVar5 + iVar19 >> auVar29;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x200);
    }
    else {
      lVar16 = 0;
      do {
        auVar29._0_4_ = *(int *)((long)&local_2838 + lVar16) << iVar13;
        auVar29._4_4_ = *(undefined4 *)((long)&local_2838 + lVar16 + 4);
        auVar29._8_4_ = *(undefined4 *)((long)aiStack_2830 + lVar16);
        auVar29._12_4_ = *(undefined4 *)((long)aiStack_2830 + lVar16 + 4);
        *(undefined1 (*) [16])((long)&local_2838 + lVar16) = auVar29;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x200);
    }
    lVar16 = 0;
    do {
      uVar7 = *(undefined8 *)((long)aiStack_2430 + lVar16);
      *(undefined8 *)(piVar17 + lVar16 * 2 + -4) = *(undefined8 *)((long)&local_2438 + lVar16);
      *(undefined8 *)(piVar17 + lVar16 * 2 + -4 + 2) = uVar7;
      uVar7 = *(undefined8 *)((long)aiStack_2830 + lVar16);
      *(undefined8 *)(piVar17 + lVar16 * 2) = *(undefined8 *)((long)&local_2838 + lVar16);
      *(undefined8 *)(piVar17 + lVar16 * 2 + 2) = uVar7;
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x200);
    lVar18 = lVar18 + 1;
    puVar20 = puVar20 + 0x400;
    piVar17 = piVar17 + 8;
  } while (lVar18 != 4);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x64_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m128i buf0[64], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }
  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[64];
    __m128i bufB[64];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct64_sse4_1(bufA, bufA, cos_bit_row, 1, 1);
    av1_fdct64_sse4_1(bufB, bufB, cos_bit_row, 1, 1);
    av1_round_shift_array_32_sse4_1(bufA, bufA, 32, -shift[2]);
    av1_round_shift_array_32_sse4_1(bufB, bufB, 32, -shift[2]);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}